

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O3

void __thiscall Saturation::SaturationAlgorithm::onNewClause(SaturationAlgorithm *this,Clause *cl)

{
  AnswerLiteralManager *pAVar1;
  bool bVar2;
  ostream *poVar3;
  string local_40;
  
  if (this->_splitter != (Splitter *)0x0) {
    Splitter::onNewClause(this->_splitter,cl);
  }
  if ((*(char *)(Lib::env + 0x913a) != '\0') || ((*(byte *)(Lib::env + 0x959a) & 1) != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[SA] new: ",10);
    Kernel::Clause::toString_abi_cxx11_(&local_40,cl);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  bVar2 = Kernel::Clause::isPropositional(cl);
  if (bVar2) {
    onNewUsefulPropositionalClause(this,cl);
  }
  pAVar1 = this->_answerLiteralManager;
  if (pAVar1 != (AnswerLiteralManager *)0x0) {
    (*pAVar1->_vptr_AnswerLiteralManager[3])(pAVar1,cl);
  }
  return;
}

Assistant:

void SaturationAlgorithm::onNewClause(Clause* cl)
{
#if VDEBUG && VZ3
  if (cl->isPureTheoryDescendant()){
    bool couldNotCheck = false;
    ASS_REP(TheoryInstAndSimp::isTheoryLemma(cl,couldNotCheck),cl->toString())
  }
#endif

  if (_splitter) {
    _splitter->onNewClause(cl);
  }

  if (env.options->showNew()) {
    std::cout << "[SA] new: " << cl->toString() << std::endl;
  }

  if (cl->isPropositional()) {
    onNewUsefulPropositionalClause(cl);
  }

  if (_answerLiteralManager) {
    _answerLiteralManager->onNewClause(cl);
  }
}